

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O2

int blech32_addr_decode(int *witver,uint8_t *witdata,size_t *witdata_len,char *hrp,char *addr)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  uint64_t uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint8_t *puVar10;
  size_t sVar11;
  size_t sVar12;
  bool bVar13;
  long lVar14;
  bool bVar15;
  char hrp_actual [1000];
  uint8_t data [1000];
  
  sVar3 = strlen(addr);
  if (0xfffffffffffffc1e < sVar3 - 0x3e9) {
    pcVar4 = addr + sVar3;
    sVar11 = 0;
    while ((pcVar4 = pcVar4 + -1, sVar12 = sVar3, sVar3 != sVar11 &&
           (sVar12 = sVar11, *pcVar4 != '1'))) {
      sVar11 = sVar11 + 1;
    }
    lVar14 = sVar3 - (sVar12 + 1);
    if (0xb < sVar12 && (sVar12 + 1 <= sVar3 && lVar14 != 0)) {
      uVar5 = 1;
      bVar13 = false;
      bVar15 = false;
      for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
        cVar1 = addr[lVar8];
        uVar6 = (uint)cVar1;
        if (0x5d < (byte)(cVar1 - 0x21U)) goto LAB_003f1a02;
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          bVar13 = true;
        }
        else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          bVar15 = true;
          uVar6 = uVar6 | 0x20;
        }
        hrp_actual[lVar8] = (char)uVar6;
        uVar5 = blech32_polymod_step(uVar5);
        uVar5 = uVar6 >> 5 ^ uVar5;
      }
      hrp_actual[lVar14] = '\0';
      uVar5 = blech32_polymod_step(uVar5);
      for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
        uVar5 = blech32_polymod_step(uVar5);
        uVar5 = (byte)addr[lVar8] & 0x1f ^ uVar5;
      }
      puVar10 = data;
      for (uVar9 = sVar3 - sVar12; uVar9 < sVar3; uVar9 = uVar9 + 1) {
        cVar1 = addr[uVar9];
        iVar7 = -1;
        if (-1 < (long)cVar1) {
          iVar7 = (int)blech32_charset_rev[cVar1];
        }
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          bVar13 = true;
        }
        if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          bVar15 = true;
        }
        if (iVar7 == -1) goto LAB_003f1a02;
        uVar5 = blech32_polymod_step(uVar5);
        if (uVar9 + 0xc < sVar3) {
          *puVar10 = (uint8_t)iVar7;
        }
        uVar5 = uVar5 ^ (long)iVar7;
        puVar10 = puVar10 + 1;
      }
      if ((((!bVar13) || (!bVar15)) && (0xfffffffffffffc1b < sVar12 - 0x3f1)) &&
         ((uVar5 == 1 && (iVar7 = strncmp(hrp,hrp_actual,0x3e3), data[0] < 0x11 && iVar7 == 0)))) {
        *witdata_len = 0;
        iVar7 = blech32_convert_bits(witdata,witdata_len,8,data + 1,sVar12 - 0xd,5,0);
        if (((iVar7 != 0) && (sVar2 = *witdata_len, 0xffffffffffffffbf < sVar2 - 0x42)) &&
           (((data[0] != '\0' || (sVar2 == 0x41)) || (sVar2 == 0x35)))) {
          *witver = (uint)data[0];
          return 1;
        }
      }
    }
  }
LAB_003f1a02:
  wally_clear_2(data,1000,hrp_actual,1000);
  return 0;
}

Assistant:

static int blech32_addr_decode(int *witver, uint8_t *witdata, size_t *witdata_len, const char *hrp, const char *addr) {
    uint8_t data[WALLY_BLECH32_MAXLEN];
    char hrp_actual[WALLY_BLECH32_MAXLEN];
    size_t data_len;
    if (!blech32_decode(hrp_actual, data, &data_len, addr, WALLY_BLECH32_MAXLEN)) goto fail;
    if (data_len == 0 || data_len > (WALLY_BLECH32_MAXLEN - 4)) goto fail;
    if (strncmp(hrp, hrp_actual, WALLY_BLECH32_MAXLEN - 5) != 0) goto fail;
    if (data[0] > 16) goto fail;
    *witdata_len = 0;
    if (!blech32_convert_bits(witdata, witdata_len, 8, data + 1, data_len - 1, 5, 0)) goto fail;
    if (*witdata_len < 2 || *witdata_len > 65) goto fail;
    if (data[0] == 0 && *witdata_len != 53 && *witdata_len != 65) goto fail;
    *witver = data[0];
    return 1;
fail:
    wally_clear_2(data, sizeof(data), hrp_actual, sizeof(hrp_actual));
    return 0;
}